

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 152.test.cpp
# Opt level: O2

string * chunkWithOneDilution_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             " 9.423900+4 2.369986+2          1          0          0          29437 2152     \n 0.000000+0 0.000000+0          5          1         19          39437 2152     \n 1.00000+10 2.500000+3 2.009120+1 1.343187+1 4.234708+0 2.424629+09437 2152     \n 2.009120+1 2.550000+3 1.923568+1 1.375705+1 2.725074+0 2.753559+09437 2152     \n 1.923568+1 3.000000+4 1.366039+1 1.156033+1 1.572008+0 5.280525-19437 2152     \n 1.366039+1                                                       9437 2152     \n"
             ,&local_9);
  return in_RDI;
}

Assistant:

std::string chunkWithOneDilution() {
  return
    " 9.423900+4 2.369986+2          1          0          0          29437 2152     \n"
    " 0.000000+0 0.000000+0          5          1         19          39437 2152     \n"
    " 1.00000+10 2.500000+3 2.009120+1 1.343187+1 4.234708+0 2.424629+09437 2152     \n"
    " 2.009120+1 2.550000+3 1.923568+1 1.375705+1 2.725074+0 2.753559+09437 2152     \n"
    " 1.923568+1 3.000000+4 1.366039+1 1.156033+1 1.572008+0 5.280525-19437 2152     \n"
    " 1.366039+1                                                       9437 2152     \n";
}